

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

message_order * __thiscall FIX::DataDictionary::getTrailerOrderedFields(DataDictionary *this)

{
  int *order;
  message_order *this_00;
  ConfigError *this_01;
  ulong uVar1;
  allocator<char> local_39;
  message_order local_38;
  
  this_00 = &this->m_trailerOrder;
  if ((this->m_trailerOrder).m_groupOrder.m_buffer == (int *)0x0) {
    order = (this->m_trailerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
    uVar1 = (long)(this->m_trailerOrderedFields).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)order;
    if (uVar1 == 0) {
      this_01 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"<Trailer> does not have a stored message order",&local_39);
      ConfigError::ConfigError(this_01,(string *)&local_38);
      __cxa_throw(this_01,&ConfigError::typeinfo,Exception::~Exception);
    }
    message_order::message_order(&local_38,order,(int)(uVar1 >> 2));
    this_00 = message_order::operator=(this_00,&local_38);
    shared_array<int>::~shared_array(&local_38.m_groupOrder);
  }
  return this_00;
}

Assistant:

EXCEPT(ConfigError) {
  if (m_trailerOrder) {
    return m_trailerOrder;
  }

  if (m_trailerOrderedFields.size() == 0) {
    throw ConfigError("<Trailer> does not have a stored message order");
  }

  return m_trailerOrder = message_order(m_trailerOrderedFields.data(), m_trailerOrderedFields.size());
}